

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  ulong uVar9;
  uint uVar10;
  __m128i *palVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 extraout_RDX;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong size;
  long lVar24;
  bool bVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar35;
  int iVar39;
  int iVar41;
  undefined1 auVar31 [16];
  int iVar36;
  uint uVar37;
  int iVar40;
  undefined1 auVar32 [16];
  uint uVar38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar42;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  undefined1 auVar43 [16];
  int iVar49;
  uint uVar50;
  uint uVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar60 [16];
  uint uVar64;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  undefined1 auVar65 [16];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  __m128i c;
  __m128i c_00;
  uint local_170;
  int local_16c;
  size_t len;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar30 = profile->s1Len;
        uVar21 = (ulong)uVar30;
        if ((int)uVar30 < 1) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_1();
        }
        else {
          uVar16 = uVar21 + 3;
          iVar26 = ppVar4->min;
          uVar18 = 0x80000000 - iVar26;
          if (iVar26 != -open && SBORROW4(iVar26,-open) == iVar26 + open < 0) {
            uVar18 = open | 0x80000000;
          }
          uVar7 = 0x7ffffffe - ppVar4->max;
          uVar20 = (uint)uVar16 & 0x7ffffffc;
          ppVar8 = parasail_result_new_table1(uVar20,s2Len);
          if (ppVar8 != (parasail_result_t *)0x0) {
            size = uVar16 >> 2;
            ppVar8->flag = ppVar8->flag | 0x4420404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = (__dest == (__m128i *)0x0 || b_00 == (__m128i *)0x0) ||
                         (ptr == (__m128i *)0x0 || b == (__m128i *)0x0);
            if (ptr_00 != (__m128i *)0x0 &&
                ((__dest != (__m128i *)0x0 && b_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && b != (__m128i *)0x0))) {
              uVar18 = uVar18 + 1;
              uVar23 = (uint)size;
              uVar10 = -(gap * uVar23);
              len = (size_t)uVar10;
              c[0] = size;
              parasail_memset___m128i(b_00,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = size;
              parasail_memset___m128i(b,c_00,len);
              auVar59._4_4_ = gap;
              auVar59._0_4_ = gap;
              auVar59._8_4_ = gap;
              auVar59._12_4_ = gap;
              auVar58._4_4_ = open;
              auVar58._0_4_ = open;
              auVar58._8_4_ = open;
              auVar58._12_4_ = open;
              iVar26 = -open;
              iVar35 = -open;
              iVar39 = -open;
              iVar41 = -open;
              palVar11 = ptr_00 + (uVar23 - 1);
              uVar9 = size;
              do {
                *(int *)*palVar11 = iVar26;
                *(int *)((long)*palVar11 + 4) = iVar35;
                *(int *)(*palVar11 + 1) = iVar39;
                *(int *)((long)*palVar11 + 0xc) = iVar41;
                iVar26 = iVar26 - gap;
                iVar35 = iVar35 - gap;
                iVar39 = iVar39 - gap;
                iVar41 = iVar41 - gap;
                palVar11 = palVar11 + -1;
                iVar49 = (int)uVar9;
                uVar13 = iVar49 - 1;
                uVar9 = (ulong)uVar13;
              } while (uVar13 != 0 && 0 < iVar49);
              palVar11 = b_00 + (uVar23 - 1);
              uVar9 = (ulong)(uint)s2Len;
              lVar24 = (ulong)(uVar23 + (uVar23 == 0)) << 4;
              lVar17 = size * uVar9;
              lVar22 = 0;
              uVar19 = 0;
              local_16c = 0;
              uVar13 = uVar18;
              uVar61 = uVar18;
              uVar62 = uVar18;
              uVar63 = uVar18;
              uVar29 = uVar18;
              uVar38 = uVar18;
              uVar73 = uVar18;
              uVar74 = uVar18;
              uVar64 = uVar18;
              uVar66 = uVar18;
              uVar67 = uVar18;
              uVar68 = uVar18;
              uVar69 = uVar7;
              uVar70 = uVar7;
              uVar71 = uVar7;
              uVar72 = uVar7;
              local_170 = uVar18;
              do {
                iVar26 = ppVar4->mapper[(byte)s2[uVar19]];
                lVar14 = 0;
                auVar31 = (undefined1  [16])0x0;
                iVar35 = 0;
                iVar39 = (int)(*palVar11)[0];
                iVar41 = *(int *)((long)*palVar11 + 4);
                iVar49 = (int)(*palVar11)[1];
                uVar42 = uVar18;
                uVar44 = uVar18;
                uVar46 = uVar18;
                do {
                  piVar5 = (int *)((long)*b_00 + lVar14);
                  iVar45 = *piVar5;
                  iVar47 = piVar5[1];
                  iVar48 = piVar5[2];
                  iVar6 = piVar5[3];
                  piVar5 = (int *)((long)*b + lVar14);
                  piVar1 = (int *)((long)pvVar3 + lVar14 + (long)iVar26 * size * 0x10);
                  iVar35 = iVar35 + *piVar1;
                  iVar39 = iVar39 + piVar1[1];
                  iVar41 = iVar41 + piVar1[2];
                  iVar49 = iVar49 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar14);
                  iVar27 = auVar31._0_4_ + *piVar1;
                  iVar36 = auVar31._4_4_ + piVar1[1];
                  iVar40 = auVar31._8_4_ + piVar1[2];
                  auVar56._0_4_ = *piVar5 - auVar59._0_4_;
                  auVar56._4_4_ = piVar5[1] - auVar59._4_4_;
                  auVar56._8_4_ = piVar5[2] - auVar59._8_4_;
                  auVar56._12_4_ = piVar5[3] - auVar59._12_4_;
                  uVar42 = (uint)((int)uVar42 < iVar27) * iVar27 | ((int)uVar42 >= iVar27) * uVar42;
                  uVar44 = (uint)((int)uVar44 < iVar36) * iVar36 | ((int)uVar44 >= iVar36) * uVar44;
                  uVar46 = (uint)((int)uVar46 < iVar40) * iVar40 | ((int)uVar46 >= iVar40) * uVar46;
                  iVar27 = iVar45 - auVar58._0_4_;
                  iVar36 = iVar47 - auVar58._4_4_;
                  iVar40 = iVar48 - auVar58._8_4_;
                  iVar54 = iVar6 - auVar58._12_4_;
                  uVar50 = (uint)(iVar27 < auVar56._0_4_) * auVar56._0_4_ |
                           (uint)(iVar27 >= auVar56._0_4_) * iVar27;
                  uVar52 = (uint)(iVar36 < auVar56._4_4_) * auVar56._4_4_ |
                           (uint)(iVar36 >= auVar56._4_4_) * iVar36;
                  uVar53 = (uint)(iVar40 < auVar56._8_4_) * auVar56._8_4_ |
                           (uint)(iVar40 >= auVar56._8_4_) * iVar40;
                  uVar55 = (uint)(iVar54 < auVar56._12_4_) * auVar56._12_4_ |
                           (uint)(iVar54 >= auVar56._12_4_) * iVar54;
                  uVar28 = (iVar35 < (int)uVar50) * uVar50 | (uint)(iVar35 >= (int)uVar50) * iVar35;
                  uVar37 = (iVar39 < (int)uVar52) * uVar52 | (uint)(iVar39 >= (int)uVar52) * iVar39;
                  auVar31._0_8_ = CONCAT44(uVar37,uVar28);
                  auVar31._8_4_ =
                       (iVar41 < (int)uVar53) * uVar53 | (uint)(iVar41 >= (int)uVar53) * iVar41;
                  auVar31._12_4_ =
                       (iVar49 < (int)uVar55) * uVar55 | (uint)(iVar49 >= (int)uVar55) * iVar49;
                  puVar2 = (uint *)((long)*b + lVar14);
                  *puVar2 = uVar50;
                  puVar2[1] = uVar52;
                  puVar2[2] = uVar53;
                  puVar2[3] = uVar55;
                  *(undefined1 (*) [16])((long)*ptr + lVar14) = auVar31;
                  lVar14 = lVar14 + 0x10;
                  iVar35 = iVar45;
                  iVar39 = iVar47;
                  iVar41 = iVar48;
                  iVar49 = iVar6;
                } while (lVar24 != lVar14);
                iVar26 = (int)(*ptr_00)[0];
                iVar35 = *(int *)((long)*ptr_00 + 4) + uVar28;
                iVar39 = (int)(*ptr_00)[1] + uVar37;
                uVar42 = (uint)((int)uVar42 < iVar26) * iVar26 | ((int)uVar42 >= iVar26) * uVar42;
                uVar44 = (uint)((int)uVar44 < iVar35) * iVar35 | ((int)uVar44 >= iVar35) * uVar44;
                uVar46 = (uint)((int)uVar46 < iVar39) * iVar39 | ((int)uVar46 >= iVar39) * uVar46;
                iVar26 = uVar42 + uVar10;
                iVar35 = uVar44 + uVar10;
                uVar42 = ((int)uVar18 < (int)uVar42) * uVar42 |
                         ((int)uVar18 >= (int)uVar42) * uVar18;
                uVar44 = (iVar26 < (int)uVar44) * uVar44 | (uint)(iVar26 >= (int)uVar44) * iVar26;
                uVar46 = (iVar35 < (int)uVar46) * uVar46 | (uint)(iVar35 >= (int)uVar46) * iVar35;
                iVar26 = uVar42 + uVar10;
                iVar35 = uVar44 + uVar10;
                uVar50 = ((int)uVar18 < (int)uVar42) * uVar42 |
                         ((int)uVar18 >= (int)uVar42) * uVar18;
                uVar52 = (iVar26 < (int)uVar44) * uVar44 | (uint)(iVar26 >= (int)uVar44) * iVar26;
                uVar53 = (iVar35 < (int)uVar46) * uVar46 | (uint)(iVar35 >= (int)uVar46) * iVar35;
                iVar35 = (-1 < auVar31._0_8_ << 0x20) * uVar28;
                iVar41 = (-1 < (int)uVar37) * uVar37;
                iVar39 = (-1 < (long)(auVar31._8_8_ << 0x20 | (ulong)uVar37)) * auVar31._8_4_;
                iVar26 = (0 < (int)uVar18) * uVar18;
                uVar44 = (iVar35 < (int)uVar50) * uVar50 | (uint)(iVar35 >= (int)uVar50) * iVar35;
                uVar42 = (iVar41 < (int)uVar52) * uVar52 | (uint)(iVar41 >= (int)uVar52) * iVar41;
                uVar46 = (iVar39 < (int)uVar53) * uVar53 | (uint)(iVar39 >= (int)uVar53) * iVar39;
                lVar15 = 0;
                lVar14 = lVar22;
                uVar28 = uVar18;
                do {
                  iVar49 = uVar28 - auVar59._0_4_;
                  iVar45 = uVar50 - auVar59._4_4_;
                  iVar47 = uVar52 - auVar59._8_4_;
                  iVar48 = uVar53 - auVar59._12_4_;
                  iVar26 = iVar26 - auVar58._0_4_;
                  iVar35 = uVar44 - auVar58._4_4_;
                  iVar39 = uVar42 - auVar58._8_4_;
                  iVar41 = uVar46 - auVar58._12_4_;
                  uVar28 = (uint)(iVar49 < iVar26) * iVar26 | (uint)(iVar49 >= iVar26) * iVar49;
                  uVar50 = (uint)(iVar45 < iVar35) * iVar35 | (uint)(iVar45 >= iVar35) * iVar45;
                  uVar52 = (uint)(iVar47 < iVar39) * iVar39 | (uint)(iVar47 >= iVar39) * iVar47;
                  uVar53 = (uint)(iVar48 < iVar41) * iVar41 | (uint)(iVar48 >= iVar41) * iVar48;
                  piVar5 = (int *)((long)*ptr + lVar15);
                  iVar26 = *piVar5;
                  iVar35 = piVar5[1];
                  iVar39 = piVar5[2];
                  iVar41 = piVar5[3];
                  uVar37 = (iVar26 < (int)uVar28) * uVar28 | (uint)(iVar26 >= (int)uVar28) * iVar26;
                  uVar44 = (iVar35 < (int)uVar50) * uVar50 | (uint)(iVar35 >= (int)uVar50) * iVar35;
                  uVar42 = (iVar39 < (int)uVar52) * uVar52 | (uint)(iVar39 >= (int)uVar52) * iVar39;
                  uVar46 = (iVar41 < (int)uVar53) * uVar53 | (uint)(iVar41 >= (int)uVar53) * iVar41;
                  iVar26 = (-1 < (int)uVar37) * uVar37;
                  uVar44 = (-1 < (int)uVar44) * uVar44;
                  uVar42 = (-1 < (int)uVar42) * uVar42;
                  uVar46 = (-1 < (int)uVar46) * uVar46;
                  piVar5 = (int *)((long)*b_00 + lVar15);
                  *piVar5 = iVar26;
                  piVar5[1] = uVar44;
                  piVar5[2] = uVar42;
                  piVar5[3] = uVar46;
                  uVar69 = (uint)(iVar26 < (int)uVar69) * iVar26 | (iVar26 >= (int)uVar69) * uVar69;
                  uVar70 = ((int)uVar44 < (int)uVar70) * uVar44 |
                           ((int)uVar44 >= (int)uVar70) * uVar70;
                  uVar71 = ((int)uVar42 < (int)uVar71) * uVar42 |
                           ((int)uVar42 >= (int)uVar71) * uVar71;
                  uVar72 = ((int)uVar46 < (int)uVar72) * uVar46 |
                           ((int)uVar46 >= (int)uVar72) * uVar72;
                  uVar64 = (uint)((int)uVar64 < iVar26) * iVar26 | ((int)uVar64 >= iVar26) * uVar64;
                  uVar66 = ((int)uVar66 < (int)uVar44) * uVar44 |
                           ((int)uVar66 >= (int)uVar44) * uVar66;
                  uVar67 = ((int)uVar67 < (int)uVar42) * uVar42 |
                           ((int)uVar67 >= (int)uVar42) * uVar67;
                  uVar68 = ((int)uVar68 < (int)uVar46) * uVar46 |
                           ((int)uVar68 >= (int)uVar46) * uVar68;
                  piVar5 = ((ppVar8->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar14) = iVar26;
                  *(uint *)((long)piVar5 + lVar17 * 4 + lVar14) = uVar44;
                  *(uint *)((long)piVar5 + lVar17 * 8 + lVar14) = uVar42;
                  *(uint *)((long)piVar5 + lVar17 * 0xc + lVar14) = uVar46;
                  uVar13 = (uint)((int)uVar13 < iVar26) * iVar26 | ((int)uVar13 >= iVar26) * uVar13;
                  uVar61 = ((int)uVar61 < (int)uVar44) * uVar44 |
                           ((int)uVar61 >= (int)uVar44) * uVar61;
                  uVar62 = ((int)uVar62 < (int)uVar42) * uVar42 |
                           ((int)uVar62 >= (int)uVar42) * uVar62;
                  uVar63 = ((int)uVar63 < (int)uVar46) * uVar46 |
                           ((int)uVar63 >= (int)uVar46) * uVar63;
                  lVar15 = lVar15 + 0x10;
                  lVar14 = lVar14 + uVar9 * 4;
                } while (lVar24 != lVar15);
                auVar32._0_4_ = -(uint)((int)uVar29 < (int)uVar13);
                auVar32._4_4_ = -(uint)((int)uVar38 < (int)uVar61);
                auVar32._8_4_ = -(uint)((int)uVar73 < (int)uVar62);
                auVar32._12_4_ = -(uint)((int)uVar74 < (int)uVar63);
                uVar42 = movmskps((int)lVar14,auVar32);
                uVar12 = (ulong)uVar42;
                if (uVar42 != 0) {
                  uVar29 = ((int)uVar62 < (int)uVar13) * uVar13 |
                           ((int)uVar62 >= (int)uVar13) * uVar62;
                  uVar38 = ((int)uVar63 < (int)uVar61) * uVar61 |
                           ((int)uVar63 >= (int)uVar61) * uVar63;
                  uVar29 = ((int)uVar38 < (int)uVar29) * uVar29 |
                           ((int)uVar38 >= (int)uVar29) * uVar38;
                  memcpy(__dest,b_00,size << 4);
                  local_16c = (int)uVar19;
                  uVar38 = uVar29;
                  uVar73 = uVar29;
                  uVar74 = uVar29;
                  local_170 = uVar29;
                }
                uVar19 = uVar19 + 1;
                lVar22 = lVar22 + 4;
              } while (uVar19 != uVar9);
              bVar25 = (uVar16 & 0x7ffffffc) == 0;
              if (!bVar25) {
                if (bVar25) {
                  uVar20 = (uVar23 & 0x1fffffff) << 2;
                  uVar12 = (ulong)uVar20;
                  uVar16 = 0;
                  do {
                    if ((*(uint *)((long)*__dest + uVar16 * 4) == local_170) &&
                       (uVar30 = ((uint)uVar16 & 3) * uVar23 | (uint)(uVar16 >> 2) & 0x3fffffff,
                       (int)uVar30 < (int)uVar21)) {
                      uVar21 = (ulong)uVar30;
                    }
                    uVar30 = (uint)uVar21;
                    uVar16 = uVar16 + 1;
                  } while (uVar20 != (uint)uVar16);
                }
                else {
                  auVar43._4_4_ = uVar30;
                  auVar43._0_4_ = uVar30;
                  auVar43._8_4_ = uVar30;
                  auVar43._12_4_ = uVar30;
                  auVar51._4_4_ = uVar23;
                  auVar51._0_4_ = uVar23;
                  auVar51._8_4_ = uVar23;
                  auVar51._12_4_ = uVar23;
                  auVar57 = pmovsxbd(auVar56,0x3020100);
                  uVar12 = 0;
                  auVar58 = pmovsxbd(auVar58,0x3030303);
                  auVar59 = pmovsxbd(auVar59,0x4040404);
                  do {
                    puVar2 = (uint *)((long)*__dest + uVar12 * 4);
                    auVar33._0_4_ = -(uint)(*puVar2 == local_170);
                    auVar33._4_4_ = -(uint)(puVar2[1] == local_170);
                    auVar33._8_4_ = -(uint)(puVar2[2] == local_170);
                    auVar33._12_4_ = -(uint)(puVar2[3] == local_170);
                    uVar30 = auVar57._4_4_;
                    uVar10 = auVar57._8_4_;
                    uVar23 = auVar57._12_4_;
                    auVar31 = pmulld(auVar57 & auVar58,auVar51);
                    iVar35 = auVar31._0_4_ + (auVar57._0_4_ >> 2);
                    iVar39 = auVar31._4_4_ + (uVar30 >> 2);
                    iVar41 = auVar31._8_4_ + (uVar10 >> 2);
                    iVar49 = auVar31._12_4_ + (uVar23 >> 2);
                    iVar26 = auVar43._0_4_;
                    auVar60._0_4_ =
                         (uint)(iVar26 < iVar35) * iVar26 | (uint)(iVar26 >= iVar35) * iVar35;
                    iVar26 = auVar43._4_4_;
                    auVar60._4_4_ =
                         (uint)(iVar26 < iVar39) * iVar26 | (uint)(iVar26 >= iVar39) * iVar39;
                    iVar26 = auVar43._8_4_;
                    auVar60._8_4_ =
                         (uint)(iVar26 < iVar41) * iVar26 | (uint)(iVar26 >= iVar41) * iVar41;
                    iVar26 = auVar43._12_4_;
                    auVar60._12_4_ =
                         (uint)(iVar26 < iVar49) * iVar26 | (uint)(iVar26 >= iVar49) * iVar49;
                    auVar43 = blendvps(auVar43,auVar60,auVar33);
                    uVar12 = uVar12 + 4;
                    auVar57._0_4_ = auVar57._0_4_ + auVar59._0_4_;
                    auVar57._4_4_ = uVar30 + auVar59._4_4_;
                    auVar57._8_4_ = uVar10 + auVar59._8_4_;
                    auVar57._12_4_ = uVar23 + auVar59._12_4_;
                  } while (uVar20 != uVar12);
                  iVar26 = auVar43._0_4_;
                  iVar35 = auVar43._4_4_;
                  iVar39 = auVar43._8_4_;
                  iVar41 = auVar43._12_4_;
                  uVar30 = (uint)(iVar26 < iVar39) * iVar26 | (uint)(iVar26 >= iVar39) * iVar39;
                  uVar20 = (uint)(iVar35 < iVar41) * iVar35 | (uint)(iVar35 >= iVar41) * iVar41;
                  uVar30 = ((int)uVar30 < (int)uVar20) * uVar30 |
                           ((int)uVar30 >= (int)uVar20) * uVar20;
                }
              }
              auVar34._0_4_ = -(uint)((int)uVar69 < (int)uVar18);
              auVar34._4_4_ = -(uint)((int)uVar70 < (int)uVar18);
              auVar34._8_4_ = -(uint)((int)uVar71 < (int)uVar18);
              auVar34._12_4_ = -(uint)((int)uVar72 < (int)uVar18);
              auVar65._0_4_ = -(uint)((int)uVar7 < (int)uVar64);
              auVar65._4_4_ = -(uint)((int)uVar7 < (int)uVar66);
              auVar65._8_4_ = -(uint)((int)uVar7 < (int)uVar67);
              auVar65._12_4_ = -(uint)((int)uVar7 < (int)uVar68);
              iVar26 = movmskps((int)uVar12,auVar65 | auVar34);
              if (iVar26 != 0) {
                *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                local_170 = 0;
                local_16c = 0;
                uVar30 = 0;
              }
              ppVar8->score = local_170;
              ppVar8->end_query = uVar30;
              ppVar8->end_ref = local_16c;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b_00);
              parasail_free(ptr);
              parasail_free(b);
              return ppVar8;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        vH = _mm_max_epi32(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            vH = _mm_max_epi32(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}